

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void free_fake_bb_insns(VARR_bb_insn_t *bb_insns)

{
  size_t sVar1;
  bb_insn_t_conflict __ptr;
  
  while( true ) {
    sVar1 = VARR_bb_insn_tlength(bb_insns);
    if (sVar1 == 0) break;
    __ptr = VARR_bb_insn_tpop(bb_insns);
    if (__ptr != (bb_insn_t_conflict)0x0) {
      remove_insn_ssa_edges(__ptr->insn);
      free(__ptr->insn);
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void free_fake_bb_insns (VARR (bb_insn_t) * bb_insns) {
  bb_insn_t bb_insn;

  while (VARR_LENGTH (bb_insn_t, bb_insns) != 0)
    if ((bb_insn = VARR_POP (bb_insn_t, bb_insns)) != NULL) {  // ??? specialized free funcs
      remove_insn_ssa_edges (bb_insn->insn);
      free (bb_insn->insn); /* we can not use gen_delete as the insn not in the list */
      free (bb_insn);
    }
}